

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions
          (DescriptorBuilder *this,FileOptions *orig_options,FileDescriptor *descriptor)

{
  vector<int,_std::allocator<int>_> options_path;
  _Vector_base<int,_std::allocator<int>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_dataplus._M_p._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_58,(int *)&local_38);
  std::operator+(&local_38,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (descriptor + 8),".dummy");
  AllocateOptionsImpl<google::protobuf::FileDescriptor>
            (this,&local_38,*(string **)descriptor,orig_options,descriptor,
             (vector<int,_std::allocator<int>_> *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(const FileOptions& orig_options,
                                        FileDescriptor* descriptor) {
  std::vector<int> options_path;
  options_path.push_back(FileDescriptorProto::kOptionsFieldNumber);
  // We add the dummy token so that LookupSymbol does the right thing.
  AllocateOptionsImpl(descriptor->package() + ".dummy", descriptor->name(),
                      orig_options, descriptor, options_path);
}